

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SySetPut(SySet *pSet,void *pItem)

{
  sxu32 sVar1;
  bool bVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  if (pSet->nUsed < pSet->nSize) goto LAB_0010f0c7;
  if (pSet->pAllocator == (SyMemBackend *)0x0) {
    pvVar3 = (void *)0xfffffffc;
LAB_0010f0c1:
    bVar2 = false;
  }
  else {
    if (pSet->nSize == 0) {
      pSet->nSize = 4;
    }
    pvVar3 = SyMemBackendRealloc(pSet->pAllocator,pSet->pBase,pSet->eSize * pSet->nSize * 2);
    if (pvVar3 == (void *)0x0) {
      pvVar3 = (void *)0xffffffff;
      goto LAB_0010f0c1;
    }
    pSet->pBase = pvVar3;
    pSet->nSize = pSet->nSize << 1;
    bVar2 = true;
  }
  if (!bVar2) {
    return (sxi32)pvVar3;
  }
LAB_0010f0c7:
  sVar1 = pSet->eSize;
  if (sVar1 != 0) {
    uVar4 = pSet->nUsed * sVar1;
    pvVar3 = pSet->pBase;
    lVar6 = 0;
    do {
      *(undefined1 *)((long)pvVar3 + lVar6 + (ulong)uVar4) = *(undefined1 *)((long)pItem + lVar6);
      iVar5 = (int)lVar6;
      if (((sVar1 - 1 == iVar5) ||
          (*(undefined1 *)((long)pvVar3 + lVar6 + (ulong)uVar4 + 1) =
                *(undefined1 *)((long)pItem + lVar6 + 1), sVar1 - 2 == iVar5)) ||
         (*(undefined1 *)((long)pvVar3 + lVar6 + (ulong)uVar4 + 2) =
               *(undefined1 *)((long)pItem + lVar6 + 2), sVar1 - 3 == iVar5)) break;
      *(undefined1 *)((long)pvVar3 + lVar6 + (ulong)uVar4 + 3) =
           *(undefined1 *)((long)pItem + lVar6 + 3);
      lVar6 = lVar6 + 4;
    } while (sVar1 != (sxu32)lVar6);
  }
  pSet->nUsed = pSet->nUsed + 1;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SySetPut(SySet *pSet, const void *pItem)
{
	unsigned char *zbase;
	if( pSet->nUsed >= pSet->nSize ){
		void *pNew;
		if( pSet->pAllocator == 0 ){
			return  SXERR_LOCKED;
		}
		if( pSet->nSize <= 0 ){
			pSet->nSize = 4;
		}
		pNew = SyMemBackendRealloc(pSet->pAllocator, pSet->pBase, pSet->eSize * pSet->nSize * 2);
		if( pNew == 0 ){
			return SXERR_MEM;
		}
		pSet->pBase = pNew;
		pSet->nSize <<= 1;
	}
	zbase = (unsigned char *)pSet->pBase;
	SX_MACRO_FAST_MEMCPY(pItem, &zbase[pSet->nUsed * pSet->eSize], pSet->eSize);
	pSet->nUsed++;	
	return SXRET_OK;
}